

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O2

void __thiscall OpenMD::MoleculeCreator::createConstraintPair(MoleculeCreator *this,Molecule *mol)

{
  double dVar1;
  BondType *pBVar2;
  bool bVar3;
  long lVar4;
  ConstraintElem *this_00;
  ConstraintElem *this_01;
  ConstraintPair *cp;
  undefined8 uVar5;
  Bond *pBVar6;
  pointer ppBVar7;
  
  ppBVar7 = (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar7 !=
      (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0018c063;
  pBVar6 = (Bond *)0x0;
  while( true ) {
    if (pBVar6 == (Bond *)0x0) {
      return;
    }
    pBVar2 = pBVar6->bondType_;
    if (pBVar2 == (BondType *)0x0) break;
    bVar3 = std::type_info::operator==
                      ((type_info *)&FixedBondType::typeinfo,(type_info *)pBVar2->_vptr_BondType[-1]
                      );
    if (bVar3) {
      lVar4 = __dynamic_cast(pBVar2,&BondType::typeinfo,&FixedBondType::typeinfo,0);
      this_00 = (ConstraintElem *)operator_new(0x28);
      ConstraintElem::ConstraintElem
                (this_00,&(*(pBVar6->super_ShortRangeInteraction).atoms_.
                            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                            _M_impl.super__Vector_impl_data._M_start)->super_StuntDouble);
      this_01 = (ConstraintElem *)operator_new(0x28);
      ConstraintElem::ConstraintElem
                (this_01,&(pBVar6->super_ShortRangeInteraction).atoms_.
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[1]->super_StuntDouble);
      cp = (ConstraintPair *)operator_new(0x28);
      dVar1 = *(double *)(lVar4 + 8);
      cp->consElem1_ = this_00;
      cp->consElem2_ = this_01;
      cp->dist2 = dVar1 * dVar1;
      cp->force_ = 0.0;
      cp->printForce_ = false;
      Molecule::addConstraintPair(mol,cp);
    }
    ppBVar7 = ppBVar7 + 1;
    pBVar6 = (Bond *)0x0;
    if (ppBVar7 !=
        (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0018c063:
      pBVar6 = *ppBVar7;
    }
  }
  uVar5 = __cxa_bad_typeid();
  operator_delete((void *)0x0,0x28);
  _Unwind_Resume(uVar5);
}

Assistant:

void MoleculeCreator::createConstraintPair(Molecule* mol) {
    // add bond constraints
    Molecule::BondIterator bi;
    Bond* bond;
    ConstraintPair* cPair;

    for (bond = mol->beginBond(bi); bond != NULL; bond = mol->nextBond(bi)) {
      BondType* bt = bond->getBondType();

      if (typeid(FixedBondType) == typeid(*bt)) {
        FixedBondType* fbt = dynamic_cast<FixedBondType*>(bt);

        ConstraintElem* consElemA = new ConstraintElem(bond->getAtomA());
        ConstraintElem* consElemB = new ConstraintElem(bond->getAtomB());
        cPair                     = new ConstraintPair(consElemA, consElemB,
                                                       fbt->getEquilibriumBondLength(), false);
        mol->addConstraintPair(cPair);
      }
    }

    // rigidbody -- rigidbody constraint is not support yet
  }